

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamRandomAccessController::CreateIndex
          (BamRandomAccessController *this,BamReaderPrivate *reader,IndexType *type)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  BamIndex *pBVar4;
  string message;
  stringstream s;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  bVar2 = BamReaderPrivate::IsOpen(reader);
  if (bVar2) {
    pBVar4 = BamIndexFactory::CreateIndexOfType(type,reader);
    if (pBVar4 == (BamIndex *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"could not create index of type: ",0x20);
      std::ostream::operator<<((ostream *)(local_1a8 + 0x10),*type);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"BamRandomAccessController::CreateIndex","");
      std::__cxx11::stringbuf::str();
      SetErrorString(this,&local_1e8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base(local_128);
      return false;
    }
    iVar3 = (*pBVar4->_vptr_BamIndex[2])(pBVar4);
    if ((char)iVar3 != '\0') {
      if (this->m_index != (BamIndex *)0x0) {
        (*this->m_index->_vptr_BamIndex[1])();
        this->m_index = (BamIndex *)0x0;
      }
      this->m_index = pBVar4;
      return true;
    }
    pcVar1 = (pBVar4->m_errorString)._M_dataplus._M_p;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,pcVar1,pcVar1 + (pBVar4->m_errorString)._M_string_length);
    std::operator+(&local_1e8,"could not create index: \n\t",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,"BamRandomAccessController::CreateIndex","");
    SetErrorString(this,&local_1c8,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
      return false;
    }
  }
  else {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"BamRandomAccessController::CreateIndex","");
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"cannot create index for unopened reader","");
    SetErrorString(this,(string *)local_1a8,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
      return false;
    }
  }
  operator_delete((void *)local_1a8._0_8_);
  return false;
}

Assistant:

bool BamRandomAccessController::CreateIndex(BamReaderPrivate* reader,
                                            const BamIndex::IndexType& type)
{
    // skip if reader is invalid
    assert(reader);
    if (!reader->IsOpen()) {
        SetErrorString("BamRandomAccessController::CreateIndex",
                       "cannot create index for unopened reader");
        return false;
    }

    // create new index of requested type
    BamIndex* newIndex = BamIndexFactory::CreateIndexOfType(type, reader);
    if (newIndex == 0) {
        std::stringstream s;
        s << "could not create index of type: " << type;
        SetErrorString("BamRandomAccessController::CreateIndex", s.str());
        return false;
    }

    // attempt to build index from current BamReader file
    if (!newIndex->Create()) {
        const std::string indexError = newIndex->GetErrorString();
        const std::string message = "could not create index: \n\t" + indexError;
        SetErrorString("BamRandomAccessController::CreateIndex", message);
        return false;
    }

    // save new index & return success
    SetIndex(newIndex);
    return true;
}